

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

Expression * __thiscall Plus::assign(Plus *this,string *var,Expression *expression)

{
  Expression *pEVar1;
  int iVar2;
  int iVar3;
  Expression *pEVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string local_70 [32];
  string local_50 [32];
  
  pEVar4 = (Expression *)operator_new(0x18);
  pEVar1 = this->left;
  std::__cxx11::string::string(local_70,(string *)var);
  iVar2 = (*pEVar1->_vptr_Expression[2])(pEVar1,local_70,expression);
  pEVar1 = this->right;
  std::__cxx11::string::string(local_50,(string *)var);
  iVar3 = (*pEVar1->_vptr_Expression[2])(pEVar1,local_50,expression);
  pEVar4->_vptr_Expression = (_func_int **)&PTR_calculate_0012a788;
  pEVar4[1]._vptr_Expression = (_func_int **)CONCAT44(extraout_var,iVar2);
  pEVar4[2]._vptr_Expression = (_func_int **)CONCAT44(extraout_var_00,iVar3);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  return pEVar4;
}

Assistant:

Expression *Plus::assign(string var, Expression *expression) {
    return new Plus(left->assign(var, expression), right->assign(var, expression));
}